

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTableFormatter.cpp
# Opt level: O0

ostream * cali::format_record_as_table
                    (CaliperMetadataAccessInterface *db,
                    vector<cali::Entry,_std::allocator<cali::Entry>_> *rec,ostream *os)

{
  ostream *poVar1;
  RecordInfo local_48;
  ostream *local_20;
  ostream *os_local;
  vector<cali::Entry,_std::allocator<cali::Entry>_> *rec_local;
  CaliperMetadataAccessInterface *db_local;
  
  local_20 = os;
  os_local = (ostream *)rec;
  rec_local = (vector<cali::Entry,_std::allocator<cali::Entry>_> *)db;
  anon_unknown.dwarf_12d03b::unpack_record(&local_48,db,rec);
  poVar1 = anon_unknown.dwarf_12d03b::write_record_data(&local_48,local_20);
  anon_unknown.dwarf_12d03b::RecordInfo::~RecordInfo(&local_48);
  return poVar1;
}

Assistant:

std::ostream& format_record_as_table(
    CaliperMetadataAccessInterface& db,
    const std::vector<Entry>&       rec,
    std::ostream&                   os
)
{
    return ::write_record_data(::unpack_record(db, rec), os);
}